

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O3

string * __thiscall
OpenMPDistScheduleClause::toString_abi_cxx11_
          (string *__return_storage_ptr__,OpenMPDistScheduleClause *this)

{
  pointer pcVar1;
  int iVar2;
  string clause_string;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"dist_schedule ","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"(","");
  if (this->dist_schedule_kind == OMPC_DIST_SCHEDULE_KIND_static) {
    std::__cxx11::string::append((char *)local_70);
  }
  pcVar1 = (this->chunk_size)._M_dataplus._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + (this->chunk_size)._M_string_length);
  iVar2 = std::__cxx11::string::compare((char *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (iVar2 != 0) {
    std::__cxx11::string::append((char *)local_70);
    pcVar1 = (this->chunk_size)._M_dataplus._M_p;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar1,pcVar1 + (this->chunk_size)._M_string_length);
    std::__cxx11::string::_M_append((char *)local_70,(ulong)local_50[0]);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  std::__cxx11::string::append((char *)local_70);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_70[0]);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPDistScheduleClause::toString() {

    std::string result = "dist_schedule ";
    std::string clause_string = "(";
    OpenMPDistScheduleClauseKind kind = this->getKind();
    switch (kind) {
        case OMPC_DIST_SCHEDULE_KIND_static:
            clause_string += "static";
            break;
        default:
            ;
    }
    if (this->getChunkSize() != "") {
        clause_string += ", ";
    clause_string += this->getChunkSize();}
    clause_string += ") ";
    result += clause_string;
    return result;
}